

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

bool testing::internal::TuplePrefix<4ul>::
     Matches<std::tuple<testing::Matcher<unsigned_int>,testing::Matcher<unsigned_char>,testing::Matcher<unsigned_short>,testing::Matcher<unsigned_short>,testing::Matcher<std::__cxx11::string_const&>>,std::tuple<unsigned_int,unsigned_char,unsigned_short,unsigned_short,std::__cxx11::string_const&>>
               (tuple<testing::Matcher<unsigned_int>,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_short>,_testing::Matcher<unsigned_short>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
                *matcher_tuple,
               tuple<unsigned_int,_unsigned_char,_unsigned_short,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               *value_tuple)

{
  bool bVar1;
  MatcherBase<unsigned_short> *this;
  __tuple_element_t<3UL,_tuple<unsigned_int,_unsigned_char,_unsigned_short,_unsigned_short,_const_basic_string<char>_&>_>
  *x;
  undefined1 local_19;
  tuple<unsigned_int,_unsigned_char,_unsigned_short,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *value_tuple_local;
  tuple<testing::Matcher<unsigned_int>,_testing::Matcher<unsigned_char>,_testing::Matcher<unsigned_short>,_testing::Matcher<unsigned_short>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
  *matcher_tuple_local;
  
  bVar1 = TuplePrefix<3ul>::
          Matches<std::tuple<testing::Matcher<unsigned_int>,testing::Matcher<unsigned_char>,testing::Matcher<unsigned_short>,testing::Matcher<unsigned_short>,testing::Matcher<std::__cxx11::string_const&>>,std::tuple<unsigned_int,unsigned_char,unsigned_short,unsigned_short,std::__cxx11::string_const&>>
                    (matcher_tuple,value_tuple);
  local_19 = false;
  if (bVar1) {
    this = &std::
            get<3ul,testing::Matcher<unsigned_int>,testing::Matcher<unsigned_char>,testing::Matcher<unsigned_short>,testing::Matcher<unsigned_short>,testing::Matcher<std::__cxx11::string_const&>>
                      (matcher_tuple)->super_MatcherBase<unsigned_short>;
    x = std::
        get<3ul,unsigned_int,unsigned_char,unsigned_short,unsigned_short,std::__cxx11::string_const&>
                  (value_tuple);
    local_19 = MatcherBase<unsigned_short>::Matches(this,x);
  }
  return local_19;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple) &&
           std::get<N - 1>(matcher_tuple).Matches(std::get<N - 1>(value_tuple));
  }